

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::NegativeTest8::deinitIteration(NegativeTest8 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  NegativeTest8 *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fs_id);
    this->m_fs_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_gs_id);
    this->m_gs_id = 0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_po_id);
    this->m_po_id = 0;
  }
  if (this->m_tc_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_tc_id);
    this->m_tc_id = 0;
  }
  if (this->m_te_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_te_id);
    this->m_te_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vs_id);
    this->m_vs_id = 0;
  }
  return;
}

Assistant:

void NegativeTest8::deinitIteration()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);

		m_gs_id = 0;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_tc_id != 0)
	{
		gl.deleteShader(m_tc_id);

		m_tc_id = 0;
	}

	if (m_te_id != 0)
	{
		gl.deleteShader(m_te_id);

		m_te_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}
}